

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MoiraDasm_cpp.h
# Opt level: O3

void __thiscall
moira::Moira::dasmClr<(moira::Instr)36,(moira::Mode)6,(moira::Size)4>
          (Moira *this,StrWriter *str,u32 *addr,u16 op)

{
  int iVar1;
  char *pcVar2;
  byte *pbVar3;
  byte bVar4;
  char *pcVar5;
  char cVar6;
  Ea<(moira::Mode)6,_(moira::Size)4> dst;
  Ea<(moira::Mode)6,_(moira::Size)4> local_24;
  
  Op<(moira::Mode)6,(moira::Size)4>(&local_24,this,op & 7,addr);
  bVar4 = str->upper;
  pcVar5 = "bclr";
  if ((bool)bVar4 != false) {
    pcVar5 = "BCLR";
  }
  pcVar5 = pcVar5 + 1;
  cVar6 = *pcVar5;
  if (cVar6 != '\0') {
    do {
      pcVar5 = pcVar5 + 1;
      pcVar2 = str->ptr;
      str->ptr = pcVar2 + 1;
      *pcVar2 = cVar6;
      cVar6 = *pcVar5;
    } while (cVar6 != '\0');
    bVar4 = str->upper;
  }
  pcVar5 = str->ptr;
  str->ptr = pcVar5 + 1;
  *pcVar5 = '.';
  pbVar3 = (byte *)str->ptr;
  str->ptr = (char *)(pbVar3 + 1);
  *pbVar3 = (~bVar4 & 1) << 5 | 0x4c;
  iVar1 = (this->tab).raw;
  while (pcVar5 = str->ptr, pcVar5 < str->base + iVar1) {
    str->ptr = pcVar5 + 1;
    *pcVar5 = ' ';
  }
  StrWriter::operator<<(str,&local_24);
  return;
}

Assistant:

void
Moira::dasmClr(StrWriter &str, u32 &addr, u16 op)
{
    auto dst = Op <M,S> ( _____________xxx(op), addr );

    str << Ins<I>{} << Sz<S>{} << tab << dst;
}